

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int create_413_response(http_response_old_t *res,http_request_old_t *req)

{
  int iVar1;
  char local_a8 [4];
  int ret;
  char status_line [128];
  http_request_old_t *req_local;
  http_response_old_t *res_local;
  
  memset(local_a8,0,0x80);
  iVar1 = create_status_line(local_a8,0x80,req->http_proto,Entity_Too_Large);
  if (iVar1 == -1) {
    res_local._4_4_ = -1;
  }
  else {
    fill_http_response(res,local_a8);
    res_local._4_4_ = 0;
  }
  return res_local._4_4_;
}

Assistant:

int create_413_response(http_response_old_t *res, const http_request_old_t* req)
{
  char status_line[128]={0};
  int ret;
  if((ret = create_status_line(status_line, 128, req->http_proto, Entity_Too_Large)) == -1)
    return -1;
  fill_http_response(res, status_line);

  return 0;
}